

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  uint uVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *pIVar4;
  ulong uVar5;
  ulong uVar6;
  ImGuiWindow **ppIVar7;
  ulong uVar8;
  ulong uVar9;
  ImGuiWindow **ppIVar10;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar5 = (ulong)uVar1;
  if (uVar5 != 0) {
    uVar6 = 0;
    if ((ref_window == (ImGuiWindow *)0x0) || ((int)uVar1 < 1)) {
LAB_0017505a:
      if ((int)uVar6 < (int)uVar1) {
        ClosePopupToLevel((int)uVar6,restore_focus_to_window_under_popup);
        return;
      }
    }
    else {
      pIVar3 = (GImGui->OpenPopupStack).Data;
      ppIVar7 = &pIVar3->Window;
      uVar6 = 0;
      uVar8 = uVar5;
      do {
        pIVar4 = pIVar3[uVar6].Window;
        if (pIVar4 != (ImGuiWindow *)0x0) {
          uVar2 = pIVar4->Flags;
          if ((uVar2 >> 0x1a & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                          ,0x1f3b,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          uVar9 = uVar8;
          ppIVar10 = ppIVar7;
          if ((uVar2 >> 0x18 & 1) == 0) {
            while ((*ppIVar10 == (ImGuiWindow *)0x0 ||
                   ((*ppIVar10)->RootWindow != ref_window->RootWindow))) {
              uVar9 = uVar9 - 1;
              ppIVar10 = ppIVar10 + 6;
              if (uVar9 == 0) goto LAB_0017505a;
            }
          }
        }
        uVar6 = uVar6 + 1;
        ppIVar7 = ppIVar7 + 6;
        uVar8 = uVar8 - 1;
      } while (uVar6 != uVar5);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}